

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Get<google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::TypeHandler>
          (RepeatedPtrFieldBase *this,int index)

{
  LogMessage *pLVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (index < 0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x6a9);
    pLVar1 = LogMessage::operator<<(&local_50,"CHECK failed: (index) >= (0): ");
    LogFinisher::operator=(&local_51,pLVar1);
    LogMessage::~LogMessage(&local_50);
  }
  if (this->current_size_ <= index) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x6aa);
    pLVar1 = LogMessage::operator<<(&local_50,"CHECK failed: (index) < (current_size_): ");
    LogFinisher::operator=(&local_51,pLVar1);
    LogMessage::~LogMessage(&local_50);
  }
  return (Type *)this->rep_->elements[index];
}

Assistant:

inline const typename TypeHandler::Type& RepeatedPtrFieldBase::Get(
    int index) const {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return *cast<TypeHandler>(rep_->elements[index]);
}